

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2c8643::EnableIfAttr::printLeft(EnableIfAttr *this,OutputStream *S)

{
  StringView R;
  
  R.Last = "";
  R.First = " [enable_if:";
  OutputStream::operator+=(S,R);
  NodeArray::printWithComma(&this->Conditions,S);
  OutputStream::operator+=(S,']');
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += " [enable_if:";
    Conditions.printWithComma(S);
    S += ']';
  }